

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O3

void __thiscall soplex::SPxSolverBase<double>::computeCoTest(SPxSolverBase<double> *this)

{
  Status stat;
  SPxOut *pSVar1;
  ostream *poVar2;
  undefined8 uVar3;
  double dVar4;
  char cVar5;
  long lVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  int iVar10;
  undefined4 extraout_XMM0_Dc;
  uint extraout_XMM0_Dd;
  Verbosity old_verbosity;
  Verbosity local_50 [2];
  undefined1 local_48 [16];
  
  dVar4 = leavetol(this);
  this->m_pricingViolUpToDate = true;
  this->m_pricingViol = 0.0;
  this->m_numViol = 0;
  (this->infeasibilities).super_IdxSet.num = 0;
  iVar7 = (this->thecovectors->set).thenum;
  iVar10 = (int)((double)iVar7 * this->sparsePricingFactor);
  if (0 < (long)iVar7) {
    local_48._8_4_ = extraout_XMM0_Dc;
    local_48._0_8_ = -dVar4;
    local_48._12_4_ = extraout_XMM0_Dd ^ 0x80000000;
    uVar9 = (long)iVar7 + 1;
    do {
      stat = ((this->super_SPxBasisBase<double>).thedesc.costat)->data[uVar9 - 2];
      if (this->theRep * stat < 1) {
        iVar7 = (int)uVar9 + -2;
        dVar4 = coTest(this,iVar7,stat);
        (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9 - 2] = dVar4;
        if (this->remainingRoundsEnter == 0) {
          if ((double)local_48._0_8_ <= dVar4) {
            (this->isInfeasible).data[uVar9 - 2] = 0;
          }
          else {
            this->m_pricingViol = this->m_pricingViol - dVar4;
            DIdxSet::addIdx(&this->infeasibilities,iVar7);
            (this->isInfeasible).data[uVar9 - 2] = 1;
            this->m_numViol = this->m_numViol + 1;
          }
          if (iVar10 < (this->infeasibilities).super_IdxSet.num) {
            pSVar1 = this->spxout;
            if ((pSVar1 != (SPxOut *)0x0) && (3 < (int)pSVar1->m_verbosity)) {
              local_50[1] = 4;
              local_50[0] = pSVar1->m_verbosity;
              (*pSVar1->_vptr_SPxOut[2])(pSVar1,local_50 + 1);
              pSVar1 = this->spxout;
              std::__ostream_insert<char,std::char_traits<char>>
                        (pSVar1->m_streams[pSVar1->m_verbosity]," --- using dense pricing",0x18);
              cVar5 = (char)pSVar1->m_streams[pSVar1->m_verbosity];
              std::ios::widen((char)*(undefined8 *)
                                     (*(long *)pSVar1->m_streams[pSVar1->m_verbosity] + -0x18) +
                              cVar5);
              std::ostream::put(cVar5);
              std::ostream::flush();
              (*this->spxout->_vptr_SPxOut[2])(this->spxout,local_50);
            }
            this->remainingRoundsEnter = 5;
            this->sparsePricingEnter = false;
            (this->infeasibilities).super_IdxSet.num = 0;
          }
        }
        else if (dVar4 < (double)local_48._0_8_) {
          this->m_pricingViol = this->m_pricingViol - dVar4;
          this->m_numViol = this->m_numViol + 1;
        }
      }
      else {
        (this->theCoTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[uVar9 - 2] = 0.0;
        if (this->remainingRoundsEnter == 0) {
          (this->isInfeasible).data[uVar9 - 2] = 0;
        }
      }
      uVar9 = uVar9 - 1;
    } while (1 < uVar9);
    iVar7 = (this->infeasibilities).super_IdxSet.num;
    if (iVar7 != 0) goto LAB_001ce425;
  }
  iVar7 = 0;
  if (this->sparsePricingEnter == false) {
    this->remainingRoundsEnter = this->remainingRoundsEnter + -1;
    return;
  }
LAB_001ce425:
  if ((iVar7 <= iVar10) && (this->sparsePricingEnter == false)) {
    pSVar1 = this->spxout;
    if ((pSVar1 != (SPxOut *)0x0) && (local_50[0] = pSVar1->m_verbosity, 3 < (int)local_50[0])) {
      local_50[1] = 4;
      (*pSVar1->_vptr_SPxOut[2])();
      poVar2 = this->spxout->m_streams[this->spxout->m_verbosity];
      uVar3 = *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 8);
      if (this->hyperPricingEnter == true) {
        pcVar8 = " --- using hypersparse pricing, ";
        lVar6 = 0x20;
      }
      else {
        pcVar8 = " --- using sparse pricing, ";
        lVar6 = 0x1b;
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,pcVar8,lVar6);
      pSVar1 = this->spxout;
      std::__ostream_insert<char,std::char_traits<char>>
                (pSVar1->m_streams[pSVar1->m_verbosity],"sparsity: ",10);
      poVar2 = pSVar1->m_streams[pSVar1->m_verbosity];
      lVar6 = *(long *)poVar2;
      *(undefined8 *)(poVar2 + *(long *)(lVar6 + -0x18) + 0x10) = 6;
      *(uint *)(poVar2 + *(long *)(lVar6 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(lVar6 + -0x18) + 0x18) & 0xfffffefb | 4;
      *(undefined8 *)(poVar2 + *(long *)(lVar6 + -0x18) + 8) = 4;
      std::ostream::_M_insert<double>
                ((double)(this->infeasibilities).super_IdxSet.num /
                 (double)(this->thecovectors->set).thenum);
      poVar2 = pSVar1->m_streams[pSVar1->m_verbosity];
      lVar6 = *(long *)poVar2;
      *(uint *)(poVar2 + *(long *)(lVar6 + -0x18) + 0x18) =
           *(uint *)(poVar2 + *(long *)(lVar6 + -0x18) + 0x18) & 0xfffffefb | 0x100;
      *(long *)(poVar2 + *(long *)(lVar6 + -0x18) + 8) = (long)(int)uVar3;
      std::ios::widen((char)*(undefined8 *)(lVar6 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      (*this->spxout->_vptr_SPxOut[2])(this->spxout,local_50);
    }
    this->sparsePricingEnter = true;
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeCoTest()
{
   int i;
   R pricingTol = leavetol();
   m_pricingViolUpToDate = true;
   m_pricingViol = 0;
   m_numViol = 0;
   infeasibilities.clear();
   int sparsitythreshold = (int)(sparsePricingFactor * dim());
   const typename SPxBasisBase<R>::Desc& ds = this->desc();

   for(i = dim() - 1; i >= 0; --i)
   {
      typename SPxBasisBase<R>::Desc::Status stat = ds.coStatus(i);

      if(isBasic(stat))
      {
         theCoTest[i] = 0;

         if(remainingRoundsEnter == 0)
            isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;
      }
      else
      {
         theCoTest[i] = coTest(i, stat);

         if(remainingRoundsEnter == 0)
         {
            if(theCoTest[i] < -pricingTol)
            {
               assert(infeasibilities.size() < infeasibilities.max());
               m_pricingViol -= theCoTest[i];
               infeasibilities.addIdx(i);
               isInfeasible[i] = SPxPricer<R>::VIOLATED;
               ++m_numViol;
            }
            else
               isInfeasible[i] = SPxPricer<R>::NOT_VIOLATED;

            if(infeasibilities.size() > sparsitythreshold)
            {
               SPX_MSG_INFO2((*this->spxout), (*this->spxout) << " --- using dense pricing"
                             << std::endl;)
               remainingRoundsEnter = SOPLEX_DENSEROUNDS;
               sparsePricingEnter = false;
               infeasibilities.clear();
            }
         }
         else if(theCoTest[i] < -pricingTol)
         {
            m_pricingViol -= theCoTest[i];
            ++m_numViol;
         }
      }
   }

   if(infeasibilities.size() == 0 && !sparsePricingEnter)
      --remainingRoundsEnter;
   else if(infeasibilities.size() <= sparsitythreshold && !sparsePricingEnter)
   {
      SPX_MSG_INFO2((*this->spxout),
                    std::streamsize prec = spxout->precision();

                    if(hyperPricingEnter)
                    (*this->spxout) << " --- using hypersparse pricing, ";
                    else
                       (*this->spxout) << " --- using sparse pricing, ";
                       (*this->spxout) << "sparsity: "
                       << std::setw(6) << std::fixed << std::setprecision(4)
                       << (R) infeasibilities.size() / dim()
                       << std::scientific << std::setprecision(int(prec))
                       << std::endl;)
            sparsePricingEnter = true;
   }
}